

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_TypeRules.h
# Opt level: O2

BinaryOperatorTypes *
soul::TypeRules::getTypesForEqualityOp(BinaryOperatorTypes *__return_storage_ptr__,Type *a,Type *b)

{
  ArraySize AVar1;
  ArraySize AVar2;
  PrimitiveType local_7c;
  Type local_78;
  BinaryOperatorTypes local_60;
  
  if ((a->category == stringLiteral) && (b->category == stringLiteral)) {
    (__return_storage_ptr__->resultType).category = primitive;
    (__return_storage_ptr__->resultType).arrayElementCategory = invalid;
    (__return_storage_ptr__->resultType).isRef = false;
    (__return_storage_ptr__->resultType).isConstant = false;
    (__return_storage_ptr__->resultType).primitiveType = bool_;
    (__return_storage_ptr__->resultType).boundingSize = 0;
    (__return_storage_ptr__->resultType).arrayElementBoundingSize = 0;
    (__return_storage_ptr__->resultType).structure.object = (Structure *)0x0;
    Type::Type(&__return_storage_ptr__->operandType,a);
    return __return_storage_ptr__;
  }
  if ((1 < (a->primitiveType).type - complex32) && (1 < (b->primitiveType).type - complex32)) {
    getTypesForComparisonOp(__return_storage_ptr__,a,b);
    return __return_storage_ptr__;
  }
  getTypesForArithmeticOp(&local_60,a,b,true);
  local_78.category = local_60.operandType.category;
  local_78.arrayElementCategory = local_60.operandType.arrayElementCategory;
  local_78.isRef = local_60.operandType.isRef;
  local_78.isConstant = local_60.operandType.isConstant;
  local_78.primitiveType.type = local_60.operandType.primitiveType.type;
  local_78.boundingSize = local_60.operandType.boundingSize;
  local_78.arrayElementBoundingSize = local_60.operandType.arrayElementBoundingSize;
  local_78.structure.object = local_60.operandType.structure.object;
  local_60.operandType.structure.object = (Structure *)0x0;
  BinaryOperatorTypes::~BinaryOperatorTypes(&local_60);
  if (local_60.operandType.category != invalid) {
    AVar1 = Type::getVectorSize(a);
    AVar2 = Type::getVectorSize(b);
    if (AVar1 == AVar2) {
      if ((a->category == vector) || (b->category == vector)) {
        local_7c.type = bool_;
        AVar1 = Type::getVectorSize(a);
        Type::createVector(&__return_storage_ptr__->resultType,&local_7c,AVar1);
        Type::Type(&__return_storage_ptr__->operandType,&local_78);
      }
      else {
        (__return_storage_ptr__->resultType).category = primitive;
        (__return_storage_ptr__->resultType).arrayElementCategory = invalid;
        (__return_storage_ptr__->resultType).isRef = false;
        (__return_storage_ptr__->resultType).isConstant = false;
        (__return_storage_ptr__->resultType).primitiveType = bool_;
        (__return_storage_ptr__->resultType).boundingSize = 0;
        (__return_storage_ptr__->resultType).arrayElementBoundingSize = 0;
        (__return_storage_ptr__->resultType).structure.object = (Structure *)0x0;
        Type::Type(&__return_storage_ptr__->operandType,&local_78);
      }
      goto LAB_0020a903;
    }
  }
  (__return_storage_ptr__->operandType).boundingSize = 0;
  (__return_storage_ptr__->operandType).arrayElementBoundingSize = 0;
  (__return_storage_ptr__->operandType).structure.object = (Structure *)0x0;
  (__return_storage_ptr__->resultType).structure.object = (Structure *)0x0;
  (__return_storage_ptr__->operandType).category = invalid;
  (__return_storage_ptr__->operandType).arrayElementCategory = invalid;
  (__return_storage_ptr__->operandType).isRef = false;
  (__return_storage_ptr__->operandType).isConstant = false;
  (__return_storage_ptr__->operandType).primitiveType = invalid;
  (__return_storage_ptr__->resultType).category = invalid;
  (__return_storage_ptr__->resultType).arrayElementCategory = invalid;
  (__return_storage_ptr__->resultType).isRef = false;
  (__return_storage_ptr__->resultType).isConstant = false;
  (__return_storage_ptr__->resultType).primitiveType = invalid;
  (__return_storage_ptr__->resultType).boundingSize = 0;
  (__return_storage_ptr__->resultType).arrayElementBoundingSize = 0;
LAB_0020a903:
  RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_78.structure);
  return __return_storage_ptr__;
}

Assistant:

static BinaryOperatorTypes getTypesForEqualityOp (const Type& a, const Type& b)
    {
        // Special case for string literals - they support ==, != but are unordered, so you can't do other comparisons
        if (a.isStringLiteral() && b.isStringLiteral())
            return { PrimitiveType::bool_, a };

        if (a.isComplex() || b.isComplex())
        {
            auto operandType = getTypesForArithmeticOp (a, b, true).operandType;

            if (operandType.isValid()
                && a.getVectorSize() == b.getVectorSize())
            {
                if (a.isVector() || b.isVector())
                    return { Type::createVector (PrimitiveType::bool_, a.getVectorSize()), operandType };

                return { PrimitiveType::bool_, operandType };
            }

            return {};
        }

        return getTypesForComparisonOp (a, b);
    }